

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahost.c
# Opt level: O3

void ai_callback(void *arg,int status,int timeouts,ares_addrinfo *result)

{
  int iVar1;
  ares_addrinfo_node *paVar2;
  long lVar3;
  char addr_buf [64];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (status == 0) {
    for (paVar2 = result->nodes; paVar2 != (ares_addrinfo_node *)0x0; paVar2 = paVar2->ai_next) {
      local_38 = 0;
      uStack_30 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      iVar1 = paVar2->ai_family;
      if (iVar1 == 2) {
        lVar3 = 4;
LAB_00101a7a:
        ares_inet_ntop(iVar1,paVar2->ai_addr->sa_data + lVar3 + -2,&local_68,0x40);
        printf("%-32s\t%s\n",result->name,&local_68);
      }
      else if (iVar1 == 10) {
        lVar3 = 8;
        goto LAB_00101a7a;
      }
    }
    ares_freeaddrinfo(result);
  }
  else {
    ai_callback_cold_1();
  }
  return;
}

Assistant:

static void ai_callback(void *arg, int status, int timeouts,
                        struct ares_addrinfo *result)
{
  struct ares_addrinfo_node *node = NULL;
  (void)timeouts;


  if (status != ARES_SUCCESS) {
    fprintf(stderr, "%s: %s\n", (char *)arg, ares_strerror(status));
    final_rv = RV_FAIL;
    return;
  }

  for (node = result->nodes; node != NULL; node = node->ai_next) {
    char        addr_buf[64] = "";
    const void *ptr          = NULL;
    if (node->ai_family == AF_INET) {
      const struct sockaddr_in *in_addr =
        (const struct sockaddr_in *)((void *)node->ai_addr);
      ptr = &in_addr->sin_addr;
    } else if (node->ai_family == AF_INET6) {
      const struct sockaddr_in6 *in_addr =
        (const struct sockaddr_in6 *)((void *)node->ai_addr);
      ptr = &in_addr->sin6_addr;
    } else {
      continue;
    }
    ares_inet_ntop(node->ai_family, ptr, addr_buf, sizeof(addr_buf));
    printf("%-32s\t%s\n", result->name, addr_buf);
  }

  ares_freeaddrinfo(result);
}